

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
find<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr>
          (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,char (*params) [7])

{
  uint uVar1;
  bool bVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  StringPtr *in_R8;
  Maybe<unsigned_long> MVar4;
  Iterator iter;
  Iterator local_60;
  size_t local_48;
  char (*local_40) [7];
  SearchKey local_38;
  StringPtr *local_30;
  size_t *local_28;
  
  local_48 = table.size_;
  local_30 = table.ptr;
  local_28 = &local_48;
  local_38._vptr_SearchKey = (_func_char_7_ **)&PTR_search_0021c340;
  local_40 = params;
  _::BTreeImpl::search(&local_60,(BTreeImpl *)&(local_30->content).size_,&local_38);
  aVar3 = extraout_RDX;
  if (((ulong)local_60.row != 0xe) && (uVar1 = (local_60.leaf)->rows[local_60.row].i, uVar1 != 0)) {
    bVar2 = String::operator==((String *)((ulong)(uVar1 - 1) * 0x20 + local_48),in_R8);
    aVar3 = extraout_RDX_00;
    if (bVar2) {
      uVar1 = (local_60.leaf)->rows[local_60.row].i;
      *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x1;
      *(ulong *)(this + 8) = (ulong)(uVar1 - 1);
      goto LAB_0016dcb0;
    }
  }
  *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x0;
LAB_0016dcb0:
  MVar4.ptr.field_1.value = aVar3.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    auto iter = impl.search(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return size_t(*iter);
    } else {
      return kj::none;
    }
  }